

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmAddExecutableCommand.cxx
# Opt level: O1

bool cmAddExecutableCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  pointer pcVar1;
  cmExecutionStatus *pcVar2;
  cmMakefile *pcVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  TargetType TVar8;
  undefined8 uVar9;
  long lVar10;
  cmTarget *pcVar11;
  uint uVar12;
  pointer input;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __first;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  string msg;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  srclists;
  undefined1 local_d8 [32];
  char local_b8 [8];
  char *local_b0;
  uint local_a8;
  uint local_a4;
  cmExecutionStatus *local_a0;
  uint local_98;
  uint local_94;
  cmMakefile *local_90;
  string local_88;
  pointer local_68;
  undefined1 local_60 [48];
  
  input = (args->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start;
  if (input == (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish) {
    local_d8._0_8_ = local_d8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_d8,"called with incorrect number of arguments","");
    std::__cxx11::string::_M_assign((string *)&status->Error);
  }
  else {
    local_90 = status->Makefile;
    __first._M_current = input + 1;
    local_a0 = status;
    if (__first._M_current ==
        (args->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_finish) {
      bVar4 = false;
      bVar6 = false;
      local_a8 = 0;
      local_a4 = 0;
      local_98 = 0;
      uVar12 = 0;
    }
    else {
      local_98 = 0;
      local_a4 = 0;
      local_a8 = 0;
      bVar6 = false;
      bVar4 = false;
      local_94 = 0;
      local_68 = input;
      do {
        uVar9 = std::__cxx11::string::compare((char *)__first._M_current);
        bVar5 = bVar6;
        if ((int)uVar9 == 0) {
          local_98 = (uint)CONCAT71((int7)((ulong)uVar9 >> 8),1);
        }
        else {
          uVar9 = std::__cxx11::string::compare((char *)__first._M_current);
          if ((int)uVar9 == 0) {
            local_a4 = (uint)CONCAT71((int7)((ulong)uVar9 >> 8),1);
          }
          else {
            uVar9 = std::__cxx11::string::compare((char *)__first._M_current);
            if ((int)uVar9 == 0) {
              local_a8 = (uint)CONCAT71((int7)((ulong)uVar9 >> 8),1);
            }
            else {
              uVar9 = std::__cxx11::string::compare((char *)__first._M_current);
              if ((int)uVar9 == 0) {
                local_94 = (uint)CONCAT71((int7)((ulong)uVar9 >> 8),1);
              }
              else if (((local_94 & 1) == 0) ||
                      (iVar7 = std::__cxx11::string::compare((char *)__first._M_current), iVar7 != 0
                      )) {
                iVar7 = std::__cxx11::string::compare((char *)__first._M_current);
                input = local_68;
                bVar5 = true;
                uVar12 = local_94;
                if (iVar7 != 0) break;
              }
              else {
                bVar4 = true;
              }
            }
          }
        }
        bVar6 = bVar5;
        __first._M_current = __first._M_current + 1;
        input = local_68;
        uVar12 = local_94;
      } while (__first._M_current !=
               (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish);
    }
    if (((uVar12 & 1) != 0) && (bVar4 == false)) {
      bVar4 = cmMakefile::IsImportedTargetGlobalScope(local_90);
    }
    bVar5 = cmGeneratorExpression::IsValidTargetName(input);
    if (bVar5) {
      bVar5 = cmGlobalGenerator::IsReservedTarget(input);
      bVar5 = !bVar5;
    }
    else {
      bVar5 = false;
    }
    if ((((byte)uVar12 | bVar6 | ~bVar5) & 1) == 0) {
      lVar10 = std::__cxx11::string::find((char)input,0x3a);
      bVar5 = lVar10 == -1;
    }
    if ((bVar5 == false) && (bVar5 = cmMakefile::CheckCMP0037(local_90,input,EXECUTABLE), !bVar5)) {
      return false;
    }
    pcVar3 = local_90;
    if ((uVar12 & 1) == 0) {
LAB_0023f1ae:
      if (!bVar6) {
        if ((uVar12 & 1) == 0) {
          pcVar1 = local_d8 + 0x10;
          local_d8._8_8_ = (char *)0x0;
          local_d8._16_8_ = local_d8._16_8_ & 0xffffffffffffff00;
          local_d8._0_8_ = pcVar1;
          bVar4 = cmMakefile::EnforceUniqueName(local_90,input,(string *)local_d8,false);
          if (bVar4) {
            if ((pointer)local_d8._0_8_ != pcVar1) {
              operator_delete((void *)local_d8._0_8_,local_d8._16_8_ + 1);
            }
          }
          else {
            std::__cxx11::string::_M_assign((string *)&local_a0->Error);
            if ((pointer)local_d8._0_8_ != pcVar1) {
              operator_delete((void *)local_d8._0_8_,local_d8._16_8_ + 1);
            }
            if (!bVar4) {
              return false;
            }
          }
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          vector<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_60,
                     __first,(args->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_finish,(allocator_type *)local_d8)
          ;
          pcVar11 = cmMakefile::AddExecutable
                              (local_90,input,
                               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)local_60,(bool)((byte)local_a8 & 1));
          if ((local_98 & 1) != 0) {
            local_d8._0_8_ = pcVar1;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_d8,"WIN32_EXECUTABLE","");
            cmTarget::SetProperty(pcVar11,(string *)local_d8,"ON");
            if ((pointer)local_d8._0_8_ != pcVar1) {
              operator_delete((void *)local_d8._0_8_,local_d8._16_8_ + 1);
            }
          }
          if ((local_a4 & 1) != 0) {
            local_d8._0_8_ = pcVar1;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"MACOSX_BUNDLE","");
            cmTarget::SetProperty(pcVar11,(string *)local_d8,"ON");
            if ((pointer)local_d8._0_8_ != pcVar1) {
              operator_delete((void *)local_d8._0_8_,local_d8._16_8_ + 1);
            }
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_60);
          return true;
        }
        pcVar11 = cmMakefile::FindTargetToUse(local_90,input,false);
        if (pcVar11 == (cmTarget *)0x0) {
          cmMakefile::AddImportedTarget(pcVar3,input,EXECUTABLE,bVar4);
          return true;
        }
        local_d8._24_8_ = (input->_M_dataplus)._M_p;
        local_d8._16_8_ = input->_M_string_length;
        local_d8._0_8_ = (pointer)0x1f;
        local_d8._8_8_ = "cannot create imported target \"";
        local_b8[0] = ';';
        local_b8[1] = '\0';
        local_b8[2] = '\0';
        local_b8[3] = '\0';
        local_b8[4] = '\0';
        local_b8[5] = '\0';
        local_b8[6] = '\0';
        local_b8[7] = '\0';
        local_b0 = "\" because another target with the same name already exists.";
        views._M_len = 3;
        views._M_array = (iterator)local_d8;
        cmCatViews_abi_cxx11_((string *)local_60,views);
        std::__cxx11::string::_M_assign((string *)&local_a0->Error);
        local_88.field_2._M_allocated_capacity = local_60._16_8_;
        local_88._M_dataplus._M_p = (pointer)local_60._0_8_;
        if ((undefined1 *)local_60._0_8_ == local_60 + 0x10) {
          return false;
        }
        goto LAB_0023f39f;
      }
      bVar6 = cmGeneratorExpression::IsValidTargetName(input);
      pcVar3 = local_90;
      pcVar2 = local_a0;
      if (!bVar6) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8
                       ,"Invalid name for ALIAS: ",input);
        std::__cxx11::string::_M_assign((string *)&local_a0->Error);
        local_88.field_2._M_allocated_capacity = local_d8._16_8_;
        local_88._M_dataplus._M_p = (pointer)local_d8._0_8_;
        if ((undefined1 *)local_d8._0_8_ == local_d8 + 0x10) {
          return false;
        }
        goto LAB_0023f39f;
      }
      if ((local_a8 & 1) == 0) {
        if (((uVar12 & 1) == 0) && (bVar4 == false)) {
          if ((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start == 0x60) {
            bVar4 = cmMakefile::IsAlias(local_90,__first._M_current);
            if (bVar4) {
              local_d8._0_8_ = (pointer)0x1c;
              local_d8._8_8_ = "cannot create ALIAS target \"";
              local_60._8_8_ = (input->_M_dataplus)._M_p;
              local_60._0_8_ = input->_M_string_length;
              cmStrCat<char[19],std::__cxx11::string,char[22]>
                        (&local_88,(cmAlphaNum *)local_d8,(cmAlphaNum *)local_60,
                         (char (*) [19])"\" because target \"",__first._M_current,
                         (char (*) [22])"\" is itself an ALIAS.");
              std::__cxx11::string::_M_assign((string *)&local_a0->Error);
            }
            else {
              pcVar11 = cmMakefile::FindTargetToUse(pcVar3,__first._M_current,true);
              if (pcVar11 == (cmTarget *)0x0) {
                local_d8._0_8_ = (pointer)0x1c;
                local_d8._8_8_ = "cannot create ALIAS target \"";
                local_60._8_8_ = (input->_M_dataplus)._M_p;
                local_60._0_8_ = input->_M_string_length;
                cmStrCat<char[19],std::__cxx11::string,char[26]>
                          (&local_88,(cmAlphaNum *)local_d8,(cmAlphaNum *)local_60,
                           (char (*) [19])"\" because target \"",__first._M_current,
                           (char (*) [26])"\" does not already exist.");
                std::__cxx11::string::_M_assign((string *)&local_a0->Error);
              }
              else {
                TVar8 = cmTarget::GetType(pcVar11);
                if (TVar8 == EXECUTABLE) {
                  bVar4 = cmTarget::IsImported(pcVar11);
                  bVar6 = true;
                  if (bVar4) {
                    bVar6 = cmTarget::IsImportedGloballyVisible(pcVar11);
                  }
                  cmMakefile::AddAlias(pcVar3,input,__first._M_current,bVar6);
                  return true;
                }
                local_d8._0_8_ = (pointer)0x1c;
                local_d8._8_8_ = "cannot create ALIAS target \"";
                local_60._8_8_ = (input->_M_dataplus)._M_p;
                local_60._0_8_ = input->_M_string_length;
                cmStrCat<char[19],std::__cxx11::string,char[24]>
                          (&local_88,(cmAlphaNum *)local_d8,(cmAlphaNum *)local_60,
                           (char (*) [19])"\" because target \"",__first._M_current,
                           (char (*) [24])"\" is not an executable.");
                std::__cxx11::string::_M_assign((string *)&local_a0->Error);
              }
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_88._M_dataplus._M_p == &local_88.field_2) {
              return false;
            }
            goto LAB_0023f39f;
          }
          local_d8._0_8_ = local_d8 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_d8,"ALIAS requires exactly one target argument.","");
          std::__cxx11::string::_M_assign((string *)&pcVar2->Error);
        }
        else {
          local_d8._0_8_ = local_d8 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_d8,"IMPORTED with ALIAS is not allowed.","");
          std::__cxx11::string::_M_assign((string *)&pcVar2->Error);
        }
      }
      else {
        local_d8._0_8_ = local_d8 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_d8,"EXCLUDE_FROM_ALL with ALIAS makes no sense.","");
        std::__cxx11::string::_M_assign((string *)&pcVar2->Error);
      }
    }
    else if ((local_98 & 1) == 0) {
      if ((local_a4 & 1) == 0) {
        if ((local_a8 & 1) == 0) goto LAB_0023f1ae;
        if ((local_a4 & 1) == 0) {
          local_d8._0_8_ = local_d8 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_d8,"may not be given EXCLUDE_FROM_ALL for an IMPORTED target.",
                     "");
          std::__cxx11::string::_M_assign((string *)&local_a0->Error);
          goto LAB_0023f390;
        }
      }
      local_d8._0_8_ = local_d8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_d8,"may not be given MACOSX_BUNDLE for an IMPORTED target.","");
      std::__cxx11::string::_M_assign((string *)&local_a0->Error);
    }
    else {
      local_d8._0_8_ = local_d8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_d8,"may not be given WIN32 for an IMPORTED target.","");
      std::__cxx11::string::_M_assign((string *)&local_a0->Error);
    }
  }
LAB_0023f390:
  local_88.field_2._M_allocated_capacity = local_d8._16_8_;
  local_88._M_dataplus._M_p = (pointer)local_d8._0_8_;
  if ((undefined1 *)local_d8._0_8_ == local_d8 + 0x10) {
    return false;
  }
LAB_0023f39f:
  operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  return false;
}

Assistant:

bool cmAddExecutableCommand(std::vector<std::string> const& args,
                            cmExecutionStatus& status)
{
  if (args.empty()) {
    status.SetError("called with incorrect number of arguments");
    return false;
  }

  cmMakefile& mf = status.GetMakefile();
  auto s = args.begin();

  std::string const& exename = *s;

  ++s;
  bool use_win32 = false;
  bool use_macbundle = false;
  bool excludeFromAll = false;
  bool importTarget = false;
  bool importGlobal = false;
  bool isAlias = false;
  while (s != args.end()) {
    if (*s == "WIN32") {
      ++s;
      use_win32 = true;
    } else if (*s == "MACOSX_BUNDLE") {
      ++s;
      use_macbundle = true;
    } else if (*s == "EXCLUDE_FROM_ALL") {
      ++s;
      excludeFromAll = true;
    } else if (*s == "IMPORTED") {
      ++s;
      importTarget = true;
    } else if (importTarget && *s == "GLOBAL") {
      ++s;
      importGlobal = true;
    } else if (*s == "ALIAS") {
      ++s;
      isAlias = true;
    } else {
      break;
    }
  }

  if (importTarget && !importGlobal) {
    importGlobal = mf.IsImportedTargetGlobalScope();
  }

  bool nameOk = cmGeneratorExpression::IsValidTargetName(exename) &&
    !cmGlobalGenerator::IsReservedTarget(exename);

  if (nameOk && !importTarget && !isAlias) {
    nameOk = exename.find(':') == std::string::npos;
  }
  if (!nameOk && !mf.CheckCMP0037(exename, cmStateEnums::EXECUTABLE)) {
    return false;
  }

  // Special modifiers are not allowed with IMPORTED signature.
  if (importTarget && (use_win32 || use_macbundle || excludeFromAll)) {
    if (use_win32) {
      status.SetError("may not be given WIN32 for an IMPORTED target.");
    } else if (use_macbundle) {
      status.SetError(
        "may not be given MACOSX_BUNDLE for an IMPORTED target.");
    } else // if(excludeFromAll)
    {
      status.SetError(
        "may not be given EXCLUDE_FROM_ALL for an IMPORTED target.");
    }
    return false;
  }
  if (isAlias) {
    if (!cmGeneratorExpression::IsValidTargetName(exename)) {
      status.SetError("Invalid name for ALIAS: " + exename);
      return false;
    }
    if (excludeFromAll) {
      status.SetError("EXCLUDE_FROM_ALL with ALIAS makes no sense.");
      return false;
    }
    if (importTarget || importGlobal) {
      status.SetError("IMPORTED with ALIAS is not allowed.");
      return false;
    }
    if (args.size() != 3) {
      status.SetError("ALIAS requires exactly one target argument.");
      return false;
    }

    std::string const& aliasedName = *s;
    if (mf.IsAlias(aliasedName)) {
      status.SetError(cmStrCat("cannot create ALIAS target \"", exename,
                               "\" because target \"", aliasedName,
                               "\" is itself an ALIAS."));
      return false;
    }
    cmTarget* aliasedTarget = mf.FindTargetToUse(aliasedName, true);
    if (!aliasedTarget) {
      status.SetError(cmStrCat("cannot create ALIAS target \"", exename,
                               "\" because target \"", aliasedName,
                               "\" does not already exist."));
      return false;
    }
    cmStateEnums::TargetType type = aliasedTarget->GetType();
    if (type != cmStateEnums::EXECUTABLE) {
      status.SetError(cmStrCat("cannot create ALIAS target \"", exename,
                               "\" because target \"", aliasedName,
                               "\" is not an executable."));
      return false;
    }
    mf.AddAlias(exename, aliasedName,
                !aliasedTarget->IsImported() ||
                  aliasedTarget->IsImportedGloballyVisible());
    return true;
  }

  // Handle imported target creation.
  if (importTarget) {
    // Make sure the target does not already exist.
    if (mf.FindTargetToUse(exename)) {
      status.SetError(cmStrCat(
        "cannot create imported target \"", exename,
        "\" because another target with the same name already exists."));
      return false;
    }

    // Create the imported target.
    mf.AddImportedTarget(exename, cmStateEnums::EXECUTABLE, importGlobal);
    return true;
  }

  // Enforce name uniqueness.
  {
    std::string msg;
    if (!mf.EnforceUniqueName(exename, msg)) {
      status.SetError(msg);
      return false;
    }
  }

  std::vector<std::string> srclists(s, args.end());
  cmTarget* tgt = mf.AddExecutable(exename, srclists, excludeFromAll);
  if (use_win32) {
    tgt->SetProperty("WIN32_EXECUTABLE", "ON");
  }
  if (use_macbundle) {
    tgt->SetProperty("MACOSX_BUNDLE", "ON");
  }

  return true;
}